

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_0::CWriter::WriteSimpleUnaryExpr(CWriter *this,Opcode opcode,char *op)

{
  size_t size;
  Newline *in_RCX;
  Opcode local_6c;
  Info local_68;
  
  local_6c.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_68,&local_6c);
  Write(this,(StackVar *)0x0);
  WriteData(this," = ",3);
  size = strlen(op);
  WriteData(this,op,size);
  WriteData(this,"(",1);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(StackVar *)0x0,(char (*) [3])0xffffffff00000000,in_RCX);
  DropTypes(this,1);
  Opcode::GetInfo(&local_68,&local_6c);
  PushType(this,local_68.result_type);
  return;
}

Assistant:

void CWriter::WriteSimpleUnaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(0, result_type), " = ", op, "(", StackVar(0), ");", Newline());
  DropTypes(1);
  PushType(opcode.GetResultType());
}